

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DialogBox.cpp
# Opt level: O3

shared_ptr<gui::Button> __thiscall gui::DialogBox::getOptionButton(DialogBox *this,size_t index)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long lVar2;
  pointer psVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  shared_ptr<gui::Button> sVar4;
  shared_ptr<gui::Button> sVar5;
  shared_ptr<gui::Button> sVar6;
  
  lVar2 = *(long *)(index + 0x248);
  if (in_RDX._M_pi <
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(*(long *)(index + 0x250) - lVar2 >> 4)) {
    in_RDX._M_pi = in_RDX._M_pi * 0x10;
    (this->super_Group).super_Container.super_ContainerBase._vptr_ContainerBase =
         *(_func_int ***)((long)&(in_RDX._M_pi)->_vptr__Sp_counted_base + lVar2);
    psVar3 = *(pointer *)((long)&(in_RDX._M_pi)->_M_use_count + lVar2);
    (this->super_Group).super_Container.super_ContainerBase.children_.
    super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
    ._M_impl.super__Vector_impl_data._M_start = psVar3;
    if (psVar3 != (pointer)0x0) {
      if (__libc_single_threaded != '\0') {
        p_Var1 = &(psVar3->super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
        *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
        sVar4.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
        sVar4.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)this;
        return (shared_ptr<gui::Button>)
               sVar4.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>;
      }
      LOCK();
      p_Var1 = &(psVar3->super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      UNLOCK();
      sVar6.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      sVar6.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<gui::Button>)
             sVar6.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>;
    }
  }
  else {
    (this->super_Group).super_Container.super_ContainerBase._vptr_ContainerBase = (_func_int **)0x0;
    (this->super_Group).super_Container.super_ContainerBase.children_.
    super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  sVar5.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi
  ;
  sVar5.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<gui::Button>)sVar5.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Button> DialogBox::getOptionButton(size_t index) const {
    if (index < optionButtons_.size()) {
        return optionButtons_[index];
    }
    return nullptr;
}